

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int compression_code_ppmd(archive *a,la_zstream *lastrm,la_zaction action)

{
  size_t *psVar1;
  uint8_t uVar2;
  int *piVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  undefined8 uVar6;
  bool bVar7;
  
  piVar3 = (int *)lastrm->real_stream;
  if (*(long *)(piVar3 + 0x12d0) != 0) {
    if (lastrm->avail_out != 0) {
      puVar5 = (uint8_t *)(*(long *)(piVar3 + 0x12cc) - *(long *)(piVar3 + 0x12d0));
      do {
        if (*(long *)(piVar3 + 0x12d0) == 0) break;
        uVar2 = *puVar5;
        puVar4 = lastrm->next_out;
        lastrm->next_out = puVar4 + 1;
        *puVar4 = uVar2;
        lastrm->avail_out = lastrm->avail_out - 1;
        lastrm->total_out = lastrm->total_out + 1;
        *(long *)(piVar3 + 0x12d0) = *(long *)(piVar3 + 0x12d0) + -1;
        puVar5 = puVar5 + 1;
      } while (lastrm->avail_out != 0);
    }
    uVar6 = 0;
    bVar7 = false;
    if (*(long *)(piVar3 + 0x12d0) == 0) {
      if (*piVar3 == 1) {
        uVar6 = 1;
        bVar7 = false;
      }
      else {
        uVar6 = *(undefined8 *)(piVar3 + 0x12ca);
        *(undefined8 *)(piVar3 + 0x12cc) = uVar6;
        bVar7 = true;
      }
    }
    if (!bVar7) {
      return (int)uVar6;
    }
  }
  bVar7 = lastrm->avail_in == 0;
  if ((!bVar7) && (lastrm->avail_out != 0)) {
    do {
      puVar5 = lastrm->next_in;
      lastrm->next_in = puVar5 + 1;
      Ppmd7_EncodeSymbol((CPpmd7 *)(piVar3 + 2),(CPpmd7z_RangeEnc *)(piVar3 + 0x12be),(int)*puVar5);
      lastrm->total_in = lastrm->total_in + 1;
      psVar1 = &lastrm->avail_in;
      *psVar1 = *psVar1 - 1;
      bVar7 = *psVar1 == 0;
      if (bVar7) break;
    } while (lastrm->avail_out != 0);
  }
  if (!(bool)(bVar7 ^ 1U | action != ARCHIVE_Z_FINISH)) {
    Ppmd7z_RangeEnc_FlushData((CPpmd7z_RangeEnc *)(piVar3 + 0x12be));
    *piVar3 = 1;
    if (*(long *)(piVar3 + 0x12d0) == 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
compression_code_ppmd(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	struct ppmd_stream *strm;

	(void)a; /* UNUSED */

	strm = (struct ppmd_stream *)lastrm->real_stream;

	/* Copy encoded data if there are remaining bytes from previous call. */
	if (strm->buff_bytes) {
		uint8_t *p = strm->buff_ptr - strm->buff_bytes;
		while (lastrm->avail_out && strm->buff_bytes) {
			*lastrm->next_out++ = *p++;
			lastrm->avail_out--;
			lastrm->total_out++;
			strm->buff_bytes--;
		}
		if (strm->buff_bytes)
			return (ARCHIVE_OK);
		if (strm->stat == 1)
			return (ARCHIVE_EOF);
		strm->buff_ptr = strm->buff;
	}
	while (lastrm->avail_in && lastrm->avail_out) {
		__archive_ppmd7_functions.Ppmd7_EncodeSymbol(
			&(strm->ppmd7_context), &(strm->range_enc),
			*lastrm->next_in++);
		lastrm->avail_in--;
		lastrm->total_in++;
	}
	if (lastrm->avail_in == 0 && action == ARCHIVE_Z_FINISH) {
		__archive_ppmd7_functions.Ppmd7z_RangeEnc_FlushData(
			&(strm->range_enc));
		strm->stat = 1;
		/* Return EOF if there are no remaining bytes. */
		if (strm->buff_bytes == 0)
			return (ARCHIVE_EOF);
	}
	return (ARCHIVE_OK);
}